

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraylist.cpp
# Opt level: O0

QByteArray * QtPrivate::QByteArrayList_join(QByteArrayList *that,char *sep,qsizetype seplen)

{
  qsizetype qVar1;
  QList<QByteArray> *in_RSI;
  QList<QByteArray> *in_RDI;
  qsizetype i;
  qsizetype size;
  qsizetype joinedSize;
  QByteArray *res;
  QList<QByteArray> *this;
  qsizetype in_stack_ffffffffffffffa8;
  QByteArrayList *in_stack_ffffffffffffffb0;
  long lVar2;
  char *in_stack_ffffffffffffffc0;
  QByteArray *in_stack_ffffffffffffffc8;
  
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x4c106a);
  qVar1 = QByteArrayList_joinedSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (qVar1 != 0) {
    QByteArray::reserve((QByteArray *)in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffc8
                       );
  }
  qVar1 = QList<QByteArray>::size(in_RSI);
  for (lVar2 = 0; lVar2 < qVar1; lVar2 = lVar2 + 1) {
    if (lVar2 != 0) {
      QByteArray::append(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,qVar1);
    }
    QList<QByteArray>::at(this,(qsizetype)in_RDI);
    QByteArray::operator+=((QByteArray *)this,(QByteArray *)in_RDI);
  }
  return (QByteArray *)this;
}

Assistant:

QByteArray QtPrivate::QByteArrayList_join(const QByteArrayList *that, const char *sep, qsizetype seplen)
{
    QByteArray res;
    if (const qsizetype joinedSize = QByteArrayList_joinedSize(that, seplen))
        res.reserve(joinedSize); // don't call reserve(0) - it allocates one byte for the NUL
    const qsizetype size = that->size();
    for (qsizetype i = 0; i < size; ++i) {
        if (i)
            res.append(sep, seplen);
        res += that->at(i);
    }
    return res;
}